

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_gl_load_GL_NV_transform_feedback(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_NV_transform_feedback != 0) {
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase",userptr);
    glad_glGetTransformFeedbackVaryingNV =
         (PFNGLGETTRANSFORMFEEDBACKVARYINGNVPROC)(*load)("glGetTransformFeedbackVaryingNV",userptr);
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange",userptr);
    glad_glTransformFeedbackAttribsNV =
         (PFNGLTRANSFORMFEEDBACKATTRIBSNVPROC)(*load)("glTransformFeedbackAttribsNV",userptr);
    glad_glBindBufferRangeNV = (PFNGLBINDBUFFERRANGENVPROC)(*load)("glBindBufferRangeNV",userptr);
    glad_glBeginTransformFeedback =
         (PFNGLBEGINTRANSFORMFEEDBACKPROC)(*load)("glBeginTransformFeedback",userptr);
    glad_glGetActiveVaryingNV = (PFNGLGETACTIVEVARYINGNVPROC)(*load)("glGetActiveVaryingNV",userptr)
    ;
    glad_glTransformFeedbackVaryingsNV =
         (PFNGLTRANSFORMFEEDBACKVARYINGSNVPROC)(*load)("glTransformFeedbackVaryingsNV",userptr);
    glad_glEndTransformFeedbackNV = (*load)("glEndTransformFeedbackNV",userptr);
    glad_glBindBufferBaseNV = (PFNGLBINDBUFFERBASENVPROC)(*load)("glBindBufferBaseNV",userptr);
    glad_glBindBufferOffsetEXT =
         (PFNGLBINDBUFFEROFFSETEXTPROC)(*load)("glBindBufferOffsetEXT",userptr);
    glad_glGetVaryingLocationNV =
         (PFNGLGETVARYINGLOCATIONNVPROC)(*load)("glGetVaryingLocationNV",userptr);
    glad_glBindBufferOffsetNV = (PFNGLBINDBUFFEROFFSETNVPROC)(*load)("glBindBufferOffsetNV",userptr)
    ;
    glad_glActiveVaryingNV = (PFNGLACTIVEVARYINGNVPROC)(*load)("glActiveVaryingNV",userptr);
    glad_glBeginTransformFeedbackNV =
         (PFNGLBEGINTRANSFORMFEEDBACKNVPROC)(*load)("glBeginTransformFeedbackNV",userptr);
    glad_glEndTransformFeedback = (*load)("glEndTransformFeedback",userptr);
    glad_glTransformFeedbackStreamAttribsNV =
         (PFNGLTRANSFORMFEEDBACKSTREAMATTRIBSNVPROC)
         (*load)("glTransformFeedbackStreamAttribsNV",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_NV_transform_feedback( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_NV_transform_feedback) return;
    glBindBufferBase = (PFNGLBINDBUFFERBASEPROC) load("glBindBufferBase", userptr);
    glGetTransformFeedbackVaryingNV = (PFNGLGETTRANSFORMFEEDBACKVARYINGNVPROC) load("glGetTransformFeedbackVaryingNV", userptr);
    glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC) load("glBindBufferRange", userptr);
    glTransformFeedbackAttribsNV = (PFNGLTRANSFORMFEEDBACKATTRIBSNVPROC) load("glTransformFeedbackAttribsNV", userptr);
    glBindBufferRangeNV = (PFNGLBINDBUFFERRANGENVPROC) load("glBindBufferRangeNV", userptr);
    glBeginTransformFeedback = (PFNGLBEGINTRANSFORMFEEDBACKPROC) load("glBeginTransformFeedback", userptr);
    glGetActiveVaryingNV = (PFNGLGETACTIVEVARYINGNVPROC) load("glGetActiveVaryingNV", userptr);
    glTransformFeedbackVaryingsNV = (PFNGLTRANSFORMFEEDBACKVARYINGSNVPROC) load("glTransformFeedbackVaryingsNV", userptr);
    glEndTransformFeedbackNV = (PFNGLENDTRANSFORMFEEDBACKNVPROC) load("glEndTransformFeedbackNV", userptr);
    glBindBufferBaseNV = (PFNGLBINDBUFFERBASENVPROC) load("glBindBufferBaseNV", userptr);
    glBindBufferOffsetEXT = (PFNGLBINDBUFFEROFFSETEXTPROC) load("glBindBufferOffsetEXT", userptr);
    glGetVaryingLocationNV = (PFNGLGETVARYINGLOCATIONNVPROC) load("glGetVaryingLocationNV", userptr);
    glBindBufferOffsetNV = (PFNGLBINDBUFFEROFFSETNVPROC) load("glBindBufferOffsetNV", userptr);
    glActiveVaryingNV = (PFNGLACTIVEVARYINGNVPROC) load("glActiveVaryingNV", userptr);
    glBeginTransformFeedbackNV = (PFNGLBEGINTRANSFORMFEEDBACKNVPROC) load("glBeginTransformFeedbackNV", userptr);
    glEndTransformFeedback = (PFNGLENDTRANSFORMFEEDBACKPROC) load("glEndTransformFeedback", userptr);
    glTransformFeedbackStreamAttribsNV = (PFNGLTRANSFORMFEEDBACKSTREAMATTRIBSNVPROC) load("glTransformFeedbackStreamAttribsNV", userptr);
}